

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

c_float vec_mean(c_float *a,c_int n)

{
  c_int i;
  c_float mean;
  c_int n_local;
  c_float *a_local;
  
  mean = 0.0;
  for (i = 0; i < n; i = i + 1) {
    mean = a[i] + mean;
  }
  return mean / (double)n;
}

Assistant:

c_float vec_mean(const c_float *a, c_int n) {
  c_float mean = 0.0;
  c_int   i;

  for (i = 0; i < n; i++) {
    mean += a[i];
  }
  mean /= (c_float)n;

  return mean;
}